

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall CVmByteArraySource::readc(CVmByteArraySource *this,void *buf,size_t len)

{
  size_t sVar1;
  size_t in_RDI;
  unsigned_long unaff_retaddr;
  uchar *in_stack_00000008;
  size_t copied;
  size_t rdlen;
  
  sVar1 = CVmObjByteArray::copy_to_buf
                    ((CVmObjByteArray *)copied,in_stack_00000008,unaff_retaddr,in_RDI);
  *(size_t *)(in_RDI + 0x18) = sVar1 + *(long *)(in_RDI + 0x18);
  return (int)sVar1;
}

Assistant:

virtual int readc(void *buf, size_t len)
    {
        /* limit the read to the available length */
        size_t rdlen = (idx + (long)len > end_idx
                        ? (size_t)(end_idx - idx) : len);

        /* copy the requested bytes */
        size_t copied = arr->copy_to_buf((unsigned char *)buf, idx + 1, rdlen);

        /* move past the bytes copied */
        idx += copied;

        /* return the number of bytes actually read */
        return copied;
    }